

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

void __thiscall
google::protobuf::io::FileOutputStream::CopyingFileOutputStream::~CopyingFileOutputStream
          (CopyingFileOutputStream *this)

{
  bool bVar1;
  LogMessage *this_00;
  LogMessage *other;
  LogMessage *in_RDI;
  char *in_stack_ffffffffffffff98;
  LogMessage *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffac;
  
  *(undefined ***)in_RDI = &PTR__CopyingFileOutputStream_00960948;
  if (((ulong)in_RDI->filename_ & 0x100000000) != 0) {
    bVar1 = Close((CopyingFileOutputStream *)in_RDI);
    if (!bVar1) {
      internal::LogMessage::LogMessage
                (in_RDI,CONCAT13(bVar1,(int3)in_stack_ffffffffffffffac),
                 (char *)in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      this_00 = internal::LogMessage::operator<<
                          (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      strerror(in_RDI->line_);
      other = internal::LogMessage::operator<<(this_00,in_stack_ffffffffffffff98);
      internal::LogFinisher::operator=((LogFinisher *)this_00,other);
      internal::LogMessage::~LogMessage((LogMessage *)0x3e3974);
    }
  }
  CopyingOutputStream::~CopyingOutputStream((CopyingOutputStream *)in_RDI);
  return;
}

Assistant:

FileOutputStream::CopyingFileOutputStream::~CopyingFileOutputStream() {
  if (close_on_delete_) {
    if (!Close()) {
      GOOGLE_LOG(ERROR) << "close() failed: " << strerror(errno_);
    }
  }
}